

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.cpp
# Opt level: O1

Ref<embree::Image> __thiscall embree::loadPPM(embree *this,FileName *fileName)

{
  pointer pcVar1;
  undefined1 auVar2 [12];
  int iVar3;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  runtime_error *prVar4;
  size_t width_00;
  long lVar5;
  long lVar6;
  size_t height_00;
  float fVar7;
  int height;
  int width;
  uchar rgb [3];
  int maxColor;
  char cty [2];
  int b;
  int g;
  Ref<embree::Image> *img;
  string type;
  fstream file;
  undefined1 auStack_2d8 [8];
  int local_2d0;
  int local_2cc;
  byte local_2c8;
  byte bStack_2c7;
  byte bStack_2c6;
  undefined1 uStack_2c5;
  undefined2 uStack_2c4;
  int local_2c0;
  undefined2 local_2ba;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  int local_298;
  int local_294;
  Image *local_290;
  undefined1 local_288 [8];
  float fStack_280;
  undefined4 uStack_27c;
  char local_278 [24];
  undefined2 *local_260;
  undefined8 local_258;
  undefined2 local_250;
  undefined1 local_24e;
  long local_240 [3];
  undefined4 auStack_224 [125];
  
  local_290 = (Image *)this;
  std::fstream::fstream(local_240);
  lVar5 = *(long *)(local_240[0] + -0x18);
  *(undefined4 *)((long)auStack_224 + lVar5) = 5;
  std::ios::clear((int)auStack_2d8 + (int)lVar5 + 0x98);
  std::fstream::open((char *)local_240,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  std::istream::read((char *)local_240,(long)&local_2ba);
  skipSpacesAndComments((fstream *)local_240);
  local_260 = &local_250;
  local_250 = local_2ba;
  local_258 = 2;
  local_24e = 0;
  std::istream::operator>>((istream *)local_240,&local_2cc);
  skipSpacesAndComments((fstream *)local_240);
  std::istream::operator>>((istream *)local_240,&local_2d0);
  skipSpacesAndComments((fstream *)local_240);
  std::istream::operator>>((istream *)local_240,&local_2c0);
  iVar3 = local_2c0;
  if (local_2c0 < 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid maxColor value in PPM file");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::ignore();
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)operator_new(0x48);
  width_00 = (size_t)local_2cc;
  height_00 = (size_t)local_2d0;
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  local_288 = (undefined1  [8])local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  ImageT<embree::Col4<unsigned_char>_>::ImageT(this_00,width_00,height_00,(string *)local_288);
  (local_290->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  local_2b8 = 0x3f800000;
  uStack_2b0 = 0;
  fVar7 = (float)iVar3;
  if (local_288 != (undefined1  [8])local_278) {
    local_2a8 = (float)iVar3;
    operator_delete((void *)local_288);
    fVar7 = local_2a8;
  }
  local_2b8 = CONCAT44(local_2b8._4_4_,(float)local_2b8 / fVar7);
  iVar3 = std::__cxx11::string::compare((char *)&local_260);
  if (iVar3 == 0) {
    if (0 < local_2d0) {
      local_2a8 = (float)local_2b8;
      fStack_2a4 = (float)local_2b8;
      fStack_2a0 = (float)local_2b8;
      fStack_29c = (float)local_2b8;
      lVar5 = 0;
      do {
        if (0 < local_2cc) {
          lVar6 = 0;
          do {
            std::istream::operator>>((istream *)local_240,(int *)&local_2c8);
            std::istream::operator>>((istream *)local_240,&local_294);
            std::istream::operator>>((istream *)local_240,&local_298);
            fStack_280 = (float)local_298 * fStack_2a4;
            local_288._4_4_ = (float)local_294 * local_2a8;
            local_288._0_4_ =
                 (float)CONCAT13(uStack_2c5,CONCAT12(bStack_2c6,CONCAT11(bStack_2c7,local_2c8))) *
                 (float)local_2b8;
            uStack_27c = 0x3f800000;
            (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])
                      (this_00,lVar6,lVar5,local_288);
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_2cc);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_2d0);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_260);
    if ((iVar3 == 0) && (local_2c0 < 0x100)) {
      if (0 < local_2d0) {
        local_2a8 = (float)local_2b8;
        fStack_2a4 = (float)local_2b8;
        fStack_2a0 = (float)local_2b8;
        fStack_29c = (float)local_2b8;
        lVar5 = 0;
        do {
          if (0 < local_2cc) {
            lVar6 = 0;
            do {
              std::istream::read((char *)local_240,(long)&local_2c8);
              fStack_280 = (float)bStack_2c6 * fStack_2a4;
              local_288._4_4_ = (float)bStack_2c7 * local_2a8;
              local_288._0_4_ = (float)local_2c8 * (float)local_2b8;
              uStack_27c = 0x3f800000;
              (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])
                        (this_00,lVar6,lVar5,local_288);
              lVar6 = lVar6 + 1;
            } while (lVar6 < local_2cc);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_2d0);
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_260);
      if ((iVar3 != 0) || (0xffff < local_2c0)) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid magic value in PPM file");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (0 < local_2d0) {
        local_2a8 = (float)local_2b8;
        fStack_2a4 = (float)local_2b8;
        fStack_2a0 = (float)local_2b8;
        fStack_29c = (float)local_2b8;
        lVar5 = 0;
        do {
          if (0 < local_2cc) {
            lVar6 = 0;
            do {
              std::istream::read((char *)local_240,(long)&local_2c8);
              auVar2._2_10_ = SUB1610(ZEXT816(0) << 0x40,6);
              auVar2._0_2_ = uStack_2c4;
              fStack_280 = (float)auVar2._0_4_ * fStack_2a4;
              local_288._4_4_ = (float)CONCAT11(uStack_2c5,bStack_2c6) * local_2a8;
              local_288._0_4_ = (float)CONCAT11(bStack_2c7,local_2c8) * (float)local_2b8;
              uStack_27c = 0x3f800000;
              (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])
                        (this_00,lVar6,lVar5,local_288);
              lVar6 = lVar6 + 1;
            } while (lVar6 < local_2cc);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_2d0);
      }
    }
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  std::fstream::~fstream(local_240);
  return (Ref<embree::Image>)local_290;
}

Assistant:

Ref<Image> loadPPM(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    /* read file type */
    char cty[2]; file.read(cty,2);
    skipSpacesAndComments(file);
    std::string type(cty,2);

    /* read width, height, and maximum color value */
    int width; file >> width;
    skipSpacesAndComments(file);
    int height; file >> height;
    skipSpacesAndComments(file);
    int maxColor; file >> maxColor;
    if (maxColor <= 0) THROW_RUNTIME_ERROR("Invalid maxColor value in PPM file");
    float rcpMaxColor = 1.0f/float(maxColor);
    file.ignore(); // skip space or return

    /* create image and fill with data */
    Ref<Image> img = new Image4uc(width,height,fileName);

    /* image in text format */
    if (type == "P3")
    {
      int r, g, b;
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file >> r; file >> g; file >> b;
          img->set(x,y,Color4(float(r)*rcpMaxColor,float(g)*rcpMaxColor,float(b)*rcpMaxColor,1.0f));
        }
      }
    }

    /* image in binary format 8 bit */
    else if (type == "P6" && maxColor <= 255)
    {
      unsigned char rgb[3];
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(float(rgb[0])*rcpMaxColor,float(rgb[1])*rcpMaxColor,float(rgb[2])*rcpMaxColor,1.0f));
        }
      }
    }

    /* image in binary format 16 bit */
    else if (type == "P6" && maxColor <= 65535)
    {
      unsigned short rgb[3];
      for (ssize_t y=0; y<height; y++) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(float(rgb[0])*rcpMaxColor,float(rgb[1])*rcpMaxColor,float(rgb[2])*rcpMaxColor,1.0f));
        }
      }
    }

    /* invalid magic value */
    else {
      THROW_RUNTIME_ERROR("Invalid magic value in PPM file");
    }
    return img;
  }